

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetKeywordToken(Token *__return_storage_ptr__,WastLexer *this)

{
  TokenType token_type;
  Location loc;
  Location loc_00;
  TokenInfo *pTVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  ReadReservedChars(this);
  pTVar1 = anon_unknown_8::Perfect_Hash::InWordSet
                     (this->token_start_,(long)this->cursor_ - (long)this->token_start_);
  if (pTVar1 == (TokenInfo *)0x0) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    token_type = pTVar1->token_type;
    if (token_type < First_Literal) {
      BareToken(__return_storage_ptr__,this,token_type);
    }
    else if ((token_type & ~AssertExhaustion) == First_Type) {
      GetLocation(this);
      loc.filename._M_str = (char *)uStack_40;
      loc.filename._M_len = local_48;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_38;
      loc.field_1._8_8_ = uStack_30;
      Token::Token(__return_storage_ptr__,loc,token_type,(pTVar1->field_2).value_type);
    }
    else {
      if (0x41 < token_type - AtomicFence) {
        __assert_fail("IsTokenTypeOpcode(info->token_type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-lexer.cc"
                      ,0x25a,"Token wabt::WastLexer::GetKeywordToken()");
      }
      GetLocation(this);
      loc_00.filename._M_str = (char *)uStack_60;
      loc_00.filename._M_len = local_68;
      loc_00.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_58;
      loc_00.field_1._8_8_ = uStack_50;
      Token::Token(__return_storage_ptr__,loc_00,token_type,(Opcode)(pTVar1->field_2).opcode.enum_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetKeywordToken() {
  ReadReservedChars();
  TokenInfo* info =
      Perfect_Hash::InWordSet(token_start_, cursor_ - token_start_);
  if (!info) {
    return TextToken(TokenType::Reserved);
  }
  if (IsTokenTypeBare(info->token_type)) {
    return BareToken(info->token_type);
  } else if (IsTokenTypeType(info->token_type) ||
             IsTokenTypeRefKind(info->token_type)) {
    return Token(GetLocation(), info->token_type, info->value_type);
  } else {
    assert(IsTokenTypeOpcode(info->token_type));
    return Token(GetLocation(), info->token_type, info->opcode);
  }
}